

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

void sensors_analytics::Sdk::ProfileSetNumber(string *property_name,int number_value)

{
  Sdk *this;
  string *distinct_id;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [39];
  allocator local_81;
  string local_80 [48];
  undefined1 local_50 [8];
  PropertiesNode properties_node;
  int number_value_local;
  string *property_name_local;
  
  if (instance_ != (Sdk *)0x0) {
    properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header.
    _M_node_count._4_4_ = number_value;
    PropertiesNode::PropertiesNode((PropertiesNode *)local_50);
    utils::ObjectNode::SetNumber
              ((ObjectNode *)local_50,property_name,
               properties_node.super_ObjectNode.properties_map_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count._4_4_);
    this = instance_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"profile_set",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    distinct_id = &instance_->distinct_id_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"",&local_d1);
    AddEvent(this,(string *)local_80,(string *)local_a8,(ObjectNode *)local_50,distinct_id,
             (string *)local_d0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    PropertiesNode::~PropertiesNode((PropertiesNode *)local_50);
  }
  return;
}

Assistant:

void Sdk::ProfileSetNumber(const string &property_name, int number_value) {
  if (instance_) {
    PropertiesNode properties_node;
    properties_node.SetNumber(property_name, number_value);
    instance_->AddEvent("profile_set",
                        "",
                        properties_node,
                        instance_->distinct_id_,
                        "");
  }
}